

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  string *name;
  LogMessage *other;
  FileDescriptor *pFVar1;
  int i;
  long lVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this[0x41] == (FileDescriptor)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c37);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: finished_building_ == true: ")
    ;
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  for (lVar2 = 0; lVar2 < *(int *)(this + 0x20); lVar2 = lVar2 + 1) {
    name = *(string **)(*(long *)(this + 0x50) + lVar2 * 8);
    if (name != (string *)0x0) {
      pFVar1 = DescriptorPool::FindFileByName(*(DescriptorPool **)(this + 0x10),name);
      *(FileDescriptor **)(*(long *)(this + 0x48) + lVar2 * 8) = pFVar1;
    }
  }
  return;
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  GOOGLE_CHECK(finished_building_ == true);
  for (int i = 0; i < dependency_count(); i++) {
    if (dependencies_names_[i]) {
      dependencies_[i] = pool_->FindFileByName(*dependencies_names_[i]);
    }
  }
}